

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libevent-client.c
# Opt level: O0

int on_frame_recv_callback(nghttp2_session *session,nghttp2_frame *frame,void *user_data)

{
  long in_RDX;
  long in_RSI;
  http2_session_data *session_data;
  
  if (((*(char *)(in_RSI + 0xc) == '\x01') && (*(int *)(in_RSI + 0x38) == 1)) &&
     (*(int *)(*(long *)(in_RDX + 0x18) + 0x30) == *(int *)(in_RSI + 8))) {
    fprintf(_stderr,"All headers received\n");
  }
  return 0;
}

Assistant:

static int on_frame_recv_callback(nghttp2_session *session,
                                  const nghttp2_frame *frame, void *user_data) {
  http2_session_data *session_data = (http2_session_data *)user_data;
  (void)session;

  switch (frame->hd.type) {
  case NGHTTP2_HEADERS:
    if (frame->headers.cat == NGHTTP2_HCAT_RESPONSE &&
        session_data->stream_data->stream_id == frame->hd.stream_id) {
      fprintf(stderr, "All headers received\n");
    }
    break;
  }
  return 0;
}